

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  StringOutputStream *pSVar3;
  int iVar4;
  mapped_type *ppbVar5;
  ulong uVar6;
  long lVar7;
  ostream *poVar8;
  mapped_type pbVar9;
  long lVar10;
  ulong uVar11;
  LogMessage *other;
  size_type sVar12;
  pointer pcVar13;
  ulong uVar14;
  size_type sVar15;
  pointer pcVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  MemoryOutputStream *pMVar20;
  string indent_;
  string magic_string;
  undefined1 local_1e8 [16];
  pointer local_1d8 [5];
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_0041eca8;
  pSVar3 = (this->inner_).ptr_;
  if (pSVar3 != (StringOutputStream *)0x0) {
    (*(pSVar3->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[1])();
    (this->inner_).ptr_ = (StringOutputStream *)0x0;
  }
  ppbVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[](&this->directory_->files_,&this->filename_);
  if ((this->insertion_point_)._M_string_length == 0) {
    if (*ppbVar5 == (mapped_type)0x0) {
      pbVar9 = (mapped_type)operator_new(0x20);
      (pbVar9->_M_dataplus)._M_p = (pointer)&pbVar9->field_2;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      *ppbVar5 = pbVar9;
      std::__cxx11::string::swap((string *)pbVar9);
      goto LAB_00202c95;
    }
    if (this->append_mode_ == true) {
      std::__cxx11::string::_M_append((char *)*ppbVar5,(ulong)(this->data_)._M_dataplus._M_p);
      goto LAB_00202c95;
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,": Tried to write the same file twice.",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  else {
    psVar1 = &this->data_;
    sVar12 = (this->data_)._M_string_length;
    if ((sVar12 != 0) && ((psVar1->_M_dataplus)._M_p[sVar12 - 1] != '\n')) {
      std::__cxx11::string::push_back((char)psVar1);
    }
    pbVar9 = *ppbVar5;
    if (pbVar9 != (mapped_type)0x0) {
      local_1e8._0_8_ = (this->insertion_point_)._M_dataplus._M_p;
      local_1e8._8_4_ = (undefined4)(this->insertion_point_)._M_string_length;
      indent_._M_dataplus._M_p = (pointer)0x0;
      indent_._M_string_length._0_4_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&magic_string,(strings *)"@@protoc_insertion_point($0)",local_1e8,
                 (SubstituteArg *)&indent_,&local_1b0,&local_60,&local_90,&local_c0,&local_f0,
                 &local_120,&local_150,&local_180,(SubstituteArg *)this);
      uVar6 = std::__cxx11::string::find((char *)pbVar9,(ulong)magic_string._M_dataplus._M_p,0);
      if (uVar6 == 0xffffffffffffffff) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                            (this->filename_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": insertion point \"",0x13);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(this->insertion_point_)._M_dataplus._M_p,
                            (this->insertion_point_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" not found.",0xc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        this->directory_->had_error_ = true;
      }
      else {
        if (uVar6 < 4) {
LAB_002028f9:
          lVar7 = std::__cxx11::string::rfind((char)pbVar9,10);
          uVar6 = lVar7 + 1;
        }
        else {
          uVar6 = uVar6 - 3;
          std::__cxx11::string::substr((ulong)local_1e8,(ulong)pbVar9);
          iVar4 = std::__cxx11::string::compare(local_1e8);
          if ((pointer *)local_1e8._0_8_ != local_1d8) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8[0] + 1));
          }
          if (iVar4 != 0) goto LAB_002028f9;
        }
        lVar7 = std::__cxx11::string::find_first_not_of((char *)pbVar9,0x34d53b,uVar6);
        std::__cxx11::string::string((string *)&indent_,(string *)pbVar9,uVar6,lVar7 - uVar6);
        if (CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length) == 0) {
          std::__cxx11::string::replace
                    ((ulong)pbVar9,uVar6,(char *)0x0,(ulong)(this->data_)._M_dataplus._M_p);
        }
        else {
          sVar12 = (this->data_)._M_string_length;
          uVar19 = 0;
          if (sVar12 != 0) {
            sVar15 = 0;
            do {
              iVar4 = 0;
              if ((psVar1->_M_dataplus)._M_p[sVar15] == '\n') {
                iVar4 = (int)indent_._M_string_length;
              }
              uVar18 = (int)uVar19 + iVar4;
              uVar19 = (ulong)uVar18;
              sVar15 = sVar15 + 1;
            } while (sVar12 != sVar15);
            uVar19 = (ulong)(int)uVar18;
          }
          std::__cxx11::string::insert((ulong)pbVar9,uVar6,(char)sVar12 + (char)uVar19);
          sVar12 = pbVar9->_M_string_length;
          if (sVar12 == 0) {
            pcVar16 = (pointer)0x0;
          }
          else {
            pcVar16 = (pbVar9->_M_dataplus)._M_p;
          }
          pcVar16 = pcVar16 + uVar6;
          if ((this->data_)._M_string_length == 0) {
            uVar11 = 0;
          }
          else {
            uVar14 = 0;
            pMVar20 = this;
            do {
              memcpy(pcVar16,indent_._M_dataplus._M_p,
                     CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length));
              lVar7 = CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length);
              lVar10 = std::__cxx11::string::find((char)psVar1,10);
              uVar17 = lVar10 + 1;
              memcpy(pcVar16 + lVar7,(this->data_)._M_dataplus._M_p + uVar14,uVar17 - uVar14);
              pcVar16 = pcVar16 + lVar7 + (uVar17 - uVar14);
              uVar11 = (this->data_)._M_string_length;
              uVar14 = uVar17;
            } while (uVar17 < uVar11);
            sVar12 = pbVar9->_M_string_length;
            this = pMVar20;
          }
          if (sVar12 == 0) {
            pcVar13 = (pointer)0x0;
          }
          else {
            pcVar13 = (pbVar9->_M_dataplus)._M_p;
          }
          if (pcVar16 != pcVar13 + uVar19 + uVar11 + uVar6) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_1e8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x2cc);
            other = internal::LogMessage::operator<<
                              ((LogMessage *)local_1e8,
                               "CHECK failed: (target_ptr) == (string_as_array(target) + pos + data_.size() + indent_size): "
                              );
            internal::LogFinisher::operator=((LogFinisher *)&local_1b0,other);
            internal::LogMessage::~LogMessage((LogMessage *)local_1e8);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)indent_._M_dataplus._M_p != &indent_.field_2) {
          operator_delete(indent_._M_dataplus._M_p,indent_.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)magic_string._M_dataplus._M_p != &magic_string.field_2) {
        operator_delete(magic_string._M_dataplus._M_p,magic_string.field_2._M_allocated_capacity + 1
                       );
      }
      goto LAB_00202c95;
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,": Tried to insert into file that doesn\'t exist.",0x2f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  this->directory_->had_error_ = true;
LAB_00202c95:
  pSVar3 = (this->inner_).ptr_;
  if (pSVar3 != (StringOutputStream *)0x0) {
    (*(pSVar3->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[1])();
  }
  pcVar16 = (this->data_)._M_dataplus._M_p;
  paVar2 = &(this->data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16 != paVar2) {
    operator_delete(pcVar16,paVar2->_M_allocated_capacity + 1);
  }
  pcVar16 = (this->insertion_point_)._M_dataplus._M_p;
  paVar2 = &(this->insertion_point_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16 != paVar2) {
    operator_delete(pcVar16,paVar2->_M_allocated_capacity + 1);
  }
  pcVar16 = (this->filename_)._M_dataplus._M_p;
  paVar2 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16 != paVar2) {
    operator_delete(pcVar16,paVar2->_M_allocated_capacity + 1);
  }
  io::ZeroCopyOutputStream::~ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  string** map_slot = &directory_->files_[filename_];

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (*map_slot != NULL) {
      if (append_mode_) {
        (*map_slot)->append(data_);
      } else {
        std::cerr << filename_ << ": Tried to write the same file twice."
                  << std::endl;
        directory_->had_error_ = true;
      }
      return;
    }

    *map_slot = new string;
    (*map_slot)->swap(data_);
  } else {
    // This was an OpenForInsert().

    // If the data doesn't end with a clean line break, add one.
    if (!data_.empty() && data_[data_.size() - 1] != '\n') {
      data_.push_back('\n');
    }

    // Find the file we are going to insert into.
    if (*map_slot == NULL) {
      std::cerr << filename_
                << ": Tried to insert into file that doesn't exist."
                << std::endl;
      directory_->had_error_ = true;
      return;
    }
    string* target = *map_slot;

    // Find the insertion point.
    string magic_string = strings::Substitute(
        "@@protoc_insertion_point($0)", insertion_point_);
    string::size_type pos = target->find(magic_string);

    if (pos == string::npos) {
      std::cerr << filename_ << ": insertion point \"" << insertion_point_
                << "\" not found." << std::endl;
      directory_->had_error_ = true;
      return;
    }

    if ((pos > 3) && (target->substr(pos - 3, 2) == "/*")) {
      // Support for inline "/* @@protoc_insertion_point() */"
      pos = pos - 3;
    } else {
      // Seek backwards to the beginning of the line, which is where we will
      // insert the data.  Note that this has the effect of pushing the
      // insertion point down, so the data is inserted before it.  This is
      // intentional because it means that multiple insertions at the same point
      // will end up in the expected order in the final output.
      pos = target->find_last_of('\n', pos);
      if (pos == string::npos) {
        // Insertion point is on the first line.
        pos = 0;
      } else {
        // Advance to character after '\n'.
        ++pos;
      }
    }

    // Extract indent.
    string indent_(*target, pos, target->find_first_not_of(" \t", pos) - pos);

    if (indent_.empty()) {
      // No indent.  This makes things easier.
      target->insert(pos, data_);
    } else {
      // Calculate how much space we need.
      int indent_size = 0;
      for (int i = 0; i < data_.size(); i++) {
        if (data_[i] == '\n') indent_size += indent_.size();
      }

      // Make a hole for it.
      target->insert(pos, data_.size() + indent_size, '\0');

      // Now copy in the data.
      string::size_type data_pos = 0;
      char* target_ptr = string_as_array(target) + pos;
      while (data_pos < data_.size()) {
        // Copy indent.
        memcpy(target_ptr, indent_.data(), indent_.size());
        target_ptr += indent_.size();

        // Copy line from data_.
        // We already guaranteed that data_ ends with a newline (above), so this
        // search can't fail.
        string::size_type line_length =
            data_.find_first_of('\n', data_pos) + 1 - data_pos;
        memcpy(target_ptr, data_.data() + data_pos, line_length);
        target_ptr += line_length;
        data_pos += line_length;
      }

      GOOGLE_CHECK_EQ(target_ptr,
          string_as_array(target) + pos + data_.size() + indent_size);
    }
  }
}